

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

VerifyPsbtSignRequestStruct * __thiscall
cfd::js::api::json::VerifyPsbtSignRequest::ConvertToStruct
          (VerifyPsbtSignRequestStruct *__return_storage_ptr__,VerifyPsbtSignRequest *this)

{
  vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_> local_48;
  undefined1 local_19;
  VerifyPsbtSignRequest *local_18;
  VerifyPsbtSignRequest *this_local;
  VerifyPsbtSignRequestStruct *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (VerifyPsbtSignRequest *)__return_storage_ptr__;
  VerifyPsbtSignRequestStruct::VerifyPsbtSignRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&this->psbt_);
  core::JsonObjectVector<cfd::js::api::json::OutPoint,_cfd::js::api::OutPointStruct>::
  ConvertToStruct(&local_48,&this->out_point_list_);
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::
  operator=(&__return_storage_ptr__->out_point_list,&local_48);
  std::vector<cfd::js::api::OutPointStruct,_std::allocator<cfd::js::api::OutPointStruct>_>::~vector
            (&local_48);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

VerifyPsbtSignRequestStruct VerifyPsbtSignRequest::ConvertToStruct() const {  // NOLINT
  VerifyPsbtSignRequestStruct result;
  result.psbt = psbt_;
  result.out_point_list = out_point_list_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}